

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.h
# Opt level: O2

uint32_t Ptex::v2_2::PtexUtils::floor_log2(uint32_t x)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar2 = x | x >> 1;
  uVar2 = uVar2 | uVar2 >> 2;
  uVar2 = uVar2 | uVar2 >> 4;
  uVar2 = uVar2 | uVar2 >> 8;
  uVar1 = ones(uVar2 >> 1 | uVar2 >> 0x11);
  return uVar1;
}

Assistant:

inline uint32_t floor_log2(uint32_t x)
{
    // floor(log2(n))
    x |= (x >> 1);
    x |= (x >> 2);
    x |= (x >> 4);
    x |= (x >> 8);
    x |= (x >> 16);
    return ones(x>>1);
}